

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_localAnalysisEnvironment_create(sysbvm_context_t *context,sysbvm_tuple_t parent)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).localAnalysisEnvironmentType,0xf);
  psVar1[2].header.field_0.typePointer = parent;
  sVar2 = sysbvm_identityDictionary_create(context);
  psVar1[2].field_1.pointers[0] = sVar2;
  psVar1[5].header.field_0.typePointer = 0xf;
  psVar1[5].header.identityHashAndFlags = 0xf;
  psVar1[5].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_localAnalysisEnvironment_create(sysbvm_context_t *context, sysbvm_tuple_t parent)
{
    sysbvm_localAnalysisEnvironment_t *result = (sysbvm_localAnalysisEnvironment_t*)sysbvm_context_allocatePointerTuple(context, context->roots.localAnalysisEnvironmentType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_localAnalysisEnvironment_t));
    result->super.super.super.parent = parent;
    result->super.super.super.symbolTable = sysbvm_identityDictionary_create(context);
    result->super.hasBreakTarget = SYSBVM_FALSE_TUPLE;
    result->super.hasContinueTarget = SYSBVM_FALSE_TUPLE;
    return (sysbvm_tuple_t)result;
}